

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  pointer pcVar1;
  uint uVar2;
  cmCPackLog *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  long *plVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar11;
  _Alloc_hider _Var12;
  ostringstream cmCPackLog_msg;
  string outName;
  string tempDirectory;
  string outFile;
  string destFile;
  string topDirectory;
  string line;
  ostringstream ostr;
  ostringstream cmCPackLog_msg_10;
  undefined1 local_608 [32];
  uint auStack_5e8 [20];
  ios_base local_598 [408];
  long *local_400;
  long local_3f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380 [2];
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_608,"Create temp directory.",0x16);
  std::ios::widen((char)(ostringstream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_608);
  std::ostream::flush();
  pcVar3 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar4 = local_320._0_8_;
  sVar7 = strlen((char *)local_320._0_8_);
  cmCPackLog::Log(pcVar3,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x45,(char *)uVar4,sVar7);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::ios_base::~ios_base(local_598);
  pcVar1 = local_608 + 0x10;
  local_608._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_SET_DESTDIR","");
  pcVar8 = GetOption(this,(string *)local_608);
  bVar5 = cmSystemTools::IsOn(pcVar8);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  if (bVar5) {
    iVar6 = (*(this->super_cmObject)._vptr_cmObject[0x15])(this);
    if (iVar6 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_SET_DESTDIR is set to ON but the \'",0x28);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_608,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\' generator does NOT support it.",0x20);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar3 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_320._0_8_;
      sVar7 = strlen((char *)local_320._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f,(char *)uVar4,sVar7);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
      return 0;
    }
    iVar6 = (*(this->super_cmObject)._vptr_cmObject[0x15])(this);
    if (iVar6 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_SET_DESTDIR is set to ON but it is ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"usually a bad idea to do that with \'",0x24);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_608,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\' generator. Use at your own risk.",0x22);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar3 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_320._0_8_;
      sVar7 = strlen((char *)local_320._0_8_);
      cmCPackLog::Log(pcVar3,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x58,(char *)uVar4,sVar7);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
    }
  }
  local_608._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_PACKAGE_DIRECTORY","");
  pcVar8 = GetOption(this,(string *)local_608);
  std::__cxx11::string::string((string *)&local_3c0,pcVar8,(allocator *)local_320);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_3c0);
  local_608._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_TOPLEVEL_TAG","");
  pcVar8 = GetOption(this,(string *)local_608);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  if (pcVar8 != (char *)0x0) {
    std::__cxx11::string::append((char *)&local_3c0);
    std::__cxx11::string::append((char *)&local_3c0);
  }
  local_608._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_GENERATOR","");
  GetOption(this,(string *)local_608);
  std::__cxx11::string::append((char *)&local_3c0);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_3c0,(long)local_3c0 + local_3b8);
  local_608._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_PACKAGE_FILE_NAME","");
  pcVar8 = GetOption(this,(string *)local_608);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"CPACK_PACKAGE_FILE_NAME not specified",0x25);
    std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18));
    std::ostream::put((char)local_608);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_320._0_8_;
    sVar7 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x6a,(char *)uVar4,sVar7);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    iVar6 = 0;
    goto LAB_0023315c;
  }
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  sVar7 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,pcVar8,pcVar8 + sVar7);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,"/",
                 &local_3e0);
  std::__cxx11::string::_M_append((char *)&local_3c0,local_608._0_8_);
  if ((pointer)local_608._0_8_ != pcVar1) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  iVar6 = (*(this->super_cmObject)._vptr_cmObject[5])(this);
  if (CONCAT44(extraout_var,iVar6) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"No output extension specified",0x1d);
    std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18));
    std::ostream::put((char)local_608);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_320._0_8_;
    sVar7 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x72,(char *)uVar4,sVar7);
LAB_00232588:
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    iVar6 = 0;
  }
  else {
    (*(this->super_cmObject)._vptr_cmObject[5])(this);
    std::__cxx11::string::append((char *)&local_3e0);
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_PACKAGE_DIRECTORY","");
    pcVar8 = GetOption(this,(string *)local_608);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_PACKAGE_DIRECTORY not specified",0x25);
      std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18));
      std::ostream::put((char)local_608);
      std::ostream::flush();
      pcVar3 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_320._0_8_;
      sVar7 = strlen((char *)local_320._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x7a,(char *)uVar4,sVar7);
      goto LAB_00232588;
    }
    local_380[0] = local_370;
    sVar7 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_380,pcVar8,pcVar8 + sVar7);
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_OUTPUT_FILE_PREFIX","");
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_380[0]);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                   "/",&local_3e0);
    std::__cxx11::string::_M_append((char *)local_380,local_608._0_8_);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_608,local_360,(long)local_360 + local_358);
    std::__cxx11::string::append(local_608);
    plVar10 = (long *)std::__cxx11::string::_M_append(local_608,(ulong)local_3e0._M_dataplus._M_p);
    local_3a0 = &local_390;
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_390 = *plVar11;
      lStack_388 = plVar10[3];
    }
    else {
      local_390 = *plVar11;
      local_3a0 = (long *)*plVar10;
    }
    local_398 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TOPLEVEL_DIRECTORY","");
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_360);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_DIRECTORY","");
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_3c0);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_OUTPUT_FILE_NAME","")
    ;
    SetOptionIfNotSet(this,(string *)local_608,local_3e0._M_dataplus._M_p);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_OUTPUT_FILE_PATH","")
    ;
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_380[0]);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_3a0);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_INSTALL_DIRECTORY","");
    iVar6 = (*(this->super_cmObject)._vptr_cmObject[0xb])(this);
    SetOptionIfNotSet(this,(string *)local_608,(char *)CONCAT44(extraout_var_00,iVar6));
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_NATIVE_INSTALL_DIRECTORY","");
    iVar6 = (*(this->super_cmObject)._vptr_cmObject[0xb])(this);
    std::__cxx11::string::string
              ((string *)local_1a8,(char *)CONCAT44(extraout_var_01,iVar6),(allocator *)&local_340);
    cmsys::SystemTools::ConvertToOutputPath((string *)local_320,(string *)local_1a8);
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_320._0_8_);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
    SetOptionIfNotSet(this,(string *)local_608,(char *)local_3c0);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE",0x28);
    std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18));
    std::ostream::put((char)local_608);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar4 = local_320._0_8_;
    sVar7 = strlen((char *)local_320._0_8_);
    cmCPackLog::Log(pcVar3,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x8f,(char *)uVar4,sVar7);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    local_608._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_PACKAGE_DESCRIPTION_FILE","");
    pcVar8 = GetOption(this,(string *)local_608);
    if ((pointer)local_608._0_8_ != pcVar1) {
      operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
    }
    if (pcVar8 == (char *)0x0) {
LAB_00232f7b:
      local_608._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"CPACK_PACKAGE_DESCRIPTION","");
      pcVar8 = GetOption(this,(string *)local_608);
      if ((pointer)local_608._0_8_ != pcVar1) {
        operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
      }
      if (pcVar8 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_608,
                   "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                   ,0x6e);
        std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_608);
        std::ostream::flush();
        pcVar3 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_320._0_8_;
        sVar7 = strlen((char *)local_320._0_8_);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xb4,(char *)uVar4,sVar7);
LAB_002330a8:
        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
        std::ios_base::~ios_base(local_598);
        iVar6 = 0;
      }
      else {
        local_608._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_608,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
        SetOptionIfNotSet(this,(string *)local_608,"1");
        if ((pointer)local_608._0_8_ != pcVar1) {
          operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
        }
        iVar6 = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,"Look for: ",10);
      sVar7 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,pcVar8,sVar7);
      std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18));
      std::ostream::put((char)local_608);
      std::ostream::flush();
      pcVar3 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_320._0_8_;
      sVar7 = strlen((char *)local_320._0_8_);
      cmCPackLog::Log(pcVar3,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x95,(char *)uVar4,sVar7);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
      bVar5 = cmsys::SystemTools::FileExists(pcVar8);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_608,"Cannot find description file name: [",0x24);
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,pcVar8,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,"]",1);
        std::ios::widen((char)(ostream *)local_608 + (char)*(undefined8 *)(local_608._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_608);
        std::ostream::flush();
        pcVar3 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_320._0_8_;
        sVar7 = strlen((char *)local_320._0_8_);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x9a,(char *)uVar4,sVar7);
        goto LAB_002330a8;
      }
      std::ifstream::ifstream(local_608,pcVar8,_S_in);
      uVar2 = *(uint *)((long)auStack_5e8 + *(long *)(local_608._0_8_ + -0x18));
      if ((uVar2 & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        local_340._M_string_length = 0;
        local_340.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Read description file: ",0x17);
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar7);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        pcVar3 = this->Logger;
        std::__cxx11::stringbuf::str();
        plVar10 = local_400;
        sVar7 = strlen((char *)local_400);
        cmCPackLog::Log(pcVar3,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa8,(char *)plVar10,sVar7);
        if (local_400 != local_3f0) {
          operator_delete(local_400,local_3f0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((*(byte *)((long)auStack_5e8 + *(long *)(local_608._0_8_ + -0x18)) & 5) == 0) {
          do {
            bVar5 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_608,&local_340,(bool *)0x0,-1);
            if (!bVar5) break;
            cmXMLSafe::cmXMLSafe((cmXMLSafe *)local_1a8,&local_340);
            poVar9 = operator<<((ostream *)local_320,(cmXMLSafe *)local_1a8);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
          } while ((*(byte *)((long)auStack_5e8 + *(long *)(local_608._0_8_ + -0x18)) & 5) == 0);
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_PACKAGE_DESCRIPTION","");
        std::__cxx11::stringbuf::str();
        SetOptionIfNotSet(this,(string *)local_1a8,(char *)local_400);
        if (local_400 != local_3f0) {
          operator_delete(local_400,local_3f0[0] + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          local_1a8._16_8_ =
               CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                        local_340.field_2._M_local_buf[0]);
          _Var12._M_p = local_340._M_dataplus._M_p;
          goto LAB_00232f3b;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Cannot open description file name: ",0x23);
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar8,sVar7);
        std::ios::widen((char)(ostream *)local_320 + (char)*(undefined8 *)(local_320._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_320);
        std::ostream::flush();
        pcVar3 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar4 = local_1a8._0_8_;
        sVar7 = strlen((char *)local_1a8._0_8_);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa1,(char *)uVar4,sVar7);
        _Var12._M_p = (pointer)local_1a8._0_8_;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_00232f3b:
          operator_delete(_Var12._M_p,local_1a8._16_8_ + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
      std::ifstream::~ifstream(local_608);
      iVar6 = 0;
      if ((uVar2 & 5) == 0) goto LAB_00232f7b;
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390 + 1);
    }
    if (local_380[0] != local_370) {
      operator_delete(local_380[0],local_370[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
LAB_0023315c:
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (IsOn("CPACK_SET_DESTDIR"))
    {
      if (SETDESTDIR_UNSUPPORTED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_SET_DESTDIR is set to ON but the '"
                        << Name << "' generator does NOT support it."
                        << std::endl);
          return 0;
        }
      else if (SETDESTDIR_SHOULD_NOT_BE_USED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_WARNING,
                        "CPACK_SET_DESTDIR is set to ON but it is "
                        << "usually a bad idea to do that with '"
                        << Name << "' generator. Use at your own risk."
                        << std::endl);
        }
  }

  std::string tempDirectory = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  tempDirectory += "/_CPack_Packages/";
  const char* toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if ( toplevelTag )
    {
    tempDirectory += toplevelTag;
    tempDirectory += "/";
    }
  tempDirectory += this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  const char* pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if(!pfname)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
    }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if(!this->GetOutputExtension())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
    }
  outName += this->GetOutputExtension();
  const char* pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if(!pdir)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
    }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile.c_str());
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                          outFile.c_str());
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet("CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()).c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY",
                          tempDirectory.c_str());

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  const char* descFileName
    = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if ( descFileName )
    {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if ( !cmSystemTools::FileExists(descFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                    << descFileName << "]" << std::endl);
      return 0;
      }
    cmsys::ifstream ifs(descFileName);
    if ( !ifs )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Cannot open description file name: " << descFileName << std::endl);
      return 0;
      }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
      "Read description file: " << descFileName << std::endl);
    while ( ifs && cmSystemTools::GetLineFromStream(ifs, line) )
      {
      ostr << cmXMLSafe(line) << std::endl;
      }
    this->SetOptionIfNotSet("CPACK_PACKAGE_DESCRIPTION", ostr.str().c_str());
    }
  if ( !this->GetOption("CPACK_PACKAGE_DESCRIPTION") )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
      << std::endl);
    return 0;
    }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}